

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O0

int raplcap_msr_pd_is_locked
              (raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone,raplcap_constraint constraint
              )

{
  int iVar1;
  raplcap_msr *ctx;
  off_t msr_00;
  int *piVar2;
  int local_44;
  int ret;
  off_t msr;
  raplcap_msr *state;
  uint64_t msrval;
  raplcap_constraint constraint_local;
  raplcap_zone zone_local;
  uint32_t die_local;
  uint32_t pkg_local;
  raplcap *rc_local;
  
  msrval._0_4_ = constraint;
  msrval._4_4_ = zone;
  constraint_local = die;
  zone_local = pkg;
  _die_local = rc;
  ctx = get_state(rc,pkg,die);
  msr_00 = zone_to_msr_offset(msrval._4_4_,ZONE_OFFSETS_PL);
  if ((ctx == (raplcap_msr *)0x0) || (msr_00 < 0)) {
    rc_local._4_4_ = -1;
  }
  else if (((int)(raplcap_constraint)msrval < 0) || (2 < (int)(raplcap_constraint)msrval)) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    rc_local._4_4_ = -1;
  }
  else {
    if ((raplcap_constraint)msrval < RAPLCAP_CONSTRAINT_PEAK_POWER) {
      iVar1 = msr_sys_read(ctx->sys,(uint64_t *)&state,zone_local,constraint_local,msr_00);
      if (iVar1 != 0) {
        return -1;
      }
      local_44 = msr_is_zone_locked(&ctx->ctx,msrval._4_4_,(uint64_t)state);
    }
    else if ((raplcap_constraint)msrval == RAPLCAP_CONSTRAINT_PEAK_POWER) {
      iVar1 = msr_sys_read(ctx->sys,(uint64_t *)&state,zone_local,constraint_local,0x601);
      if (iVar1 != 0) {
        return -1;
      }
      local_44 = msr_is_pl4_locked(&ctx->ctx,msrval._4_4_,(uint64_t)state);
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      local_44 = -1;
    }
    rc_local._4_4_ = local_44;
  }
  return rc_local._4_4_;
}

Assistant:

int raplcap_msr_pd_is_locked(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone,
                             raplcap_constraint constraint) {
  uint64_t msrval;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  int ret;
  raplcap_log(DEBUG, "raplcap_msr_pd_is_locked: pkg=%"PRIu32", die=%"PRIu32", zone=%d, constraint=%d\n",
              pkg, die, zone, constraint);
  if (state == NULL || msr < 0) {
    return -1;
  }
  if ((int) constraint < 0 || (int) constraint >= RAPLCAP_NCONSTRAINTS) {
    errno = EINVAL;
    return -1;
  }
  switch (constraint) {
    case RAPLCAP_CONSTRAINT_LONG_TERM:
    case RAPLCAP_CONSTRAINT_SHORT_TERM:
      if (msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
        return -1;
      }
      ret = msr_is_zone_locked(&state->ctx, zone, msrval);
      break;
    case RAPLCAP_CONSTRAINT_PEAK_POWER:
      if (msr_sys_read(state->sys, &msrval, pkg, die, MSR_VR_CURRENT_CONFIG)) {
        return -1;
      }
      ret = msr_is_pl4_locked(&state->ctx, zone, msrval);
      break;
    default:
      // unreachable
      errno = EINVAL;
      ret = -1;
      break;
  }
  return ret;
}